

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O1

void uavs3d_if_hor_luma_w32x_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  pel *ppVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  if (height != 0) {
    uVar1 = *(undefined2 *)(coeff + 6);
    auVar8._2_2_ = uVar1;
    auVar8._0_2_ = uVar1;
    auVar8._4_2_ = uVar1;
    auVar8._6_2_ = uVar1;
    auVar8._8_2_ = uVar1;
    auVar8._10_2_ = uVar1;
    auVar8._12_2_ = uVar1;
    auVar8._14_2_ = uVar1;
    auVar8._16_2_ = uVar1;
    auVar8._18_2_ = uVar1;
    auVar8._20_2_ = uVar1;
    auVar8._22_2_ = uVar1;
    auVar8._24_2_ = uVar1;
    auVar8._26_2_ = uVar1;
    auVar8._28_2_ = uVar1;
    auVar8._30_2_ = uVar1;
    uVar1 = *(undefined2 *)(coeff + 4);
    auVar9._2_2_ = uVar1;
    auVar9._0_2_ = uVar1;
    auVar9._4_2_ = uVar1;
    auVar9._6_2_ = uVar1;
    auVar9._8_2_ = uVar1;
    auVar9._10_2_ = uVar1;
    auVar9._12_2_ = uVar1;
    auVar9._14_2_ = uVar1;
    auVar9._16_2_ = uVar1;
    auVar9._18_2_ = uVar1;
    auVar9._20_2_ = uVar1;
    auVar9._22_2_ = uVar1;
    auVar9._24_2_ = uVar1;
    auVar9._26_2_ = uVar1;
    auVar9._28_2_ = uVar1;
    auVar9._30_2_ = uVar1;
    uVar1 = *(undefined2 *)(coeff + 2);
    auVar10._2_2_ = uVar1;
    auVar10._0_2_ = uVar1;
    auVar10._4_2_ = uVar1;
    auVar10._6_2_ = uVar1;
    auVar10._8_2_ = uVar1;
    auVar10._10_2_ = uVar1;
    auVar10._12_2_ = uVar1;
    auVar10._14_2_ = uVar1;
    auVar10._16_2_ = uVar1;
    auVar10._18_2_ = uVar1;
    auVar10._20_2_ = uVar1;
    auVar10._22_2_ = uVar1;
    auVar10._24_2_ = uVar1;
    auVar10._26_2_ = uVar1;
    auVar10._28_2_ = uVar1;
    auVar10._30_2_ = uVar1;
    ppVar6 = src + -3;
    uVar1 = *(undefined2 *)coeff;
    auVar11._2_2_ = uVar1;
    auVar11._0_2_ = uVar1;
    auVar11._4_2_ = uVar1;
    auVar11._6_2_ = uVar1;
    auVar11._8_2_ = uVar1;
    auVar11._10_2_ = uVar1;
    auVar11._12_2_ = uVar1;
    auVar11._14_2_ = uVar1;
    auVar11._16_2_ = uVar1;
    auVar11._18_2_ = uVar1;
    auVar11._20_2_ = uVar1;
    auVar11._22_2_ = uVar1;
    auVar11._24_2_ = uVar1;
    auVar11._26_2_ = uVar1;
    auVar11._28_2_ = uVar1;
    auVar11._30_2_ = uVar1;
    auVar12._16_16_ = _DAT_0017ee10;
    auVar12._0_16_ = _DAT_0017ee10;
    auVar13._16_16_ = _DAT_0017ee20;
    auVar13._0_16_ = _DAT_0017ee20;
    auVar14._16_16_ = _DAT_0017ee30;
    auVar14._0_16_ = _DAT_0017ee30;
    auVar15._16_16_ = _DAT_0017ee40;
    auVar15._0_16_ = _DAT_0017ee40;
    auVar16._8_2_ = 0x20;
    auVar16._0_8_ = 0x20002000200020;
    auVar16._10_2_ = 0x20;
    auVar16._12_2_ = 0x20;
    auVar16._14_2_ = 0x20;
    auVar16._16_2_ = 0x20;
    auVar16._18_2_ = 0x20;
    auVar16._20_2_ = 0x20;
    auVar16._22_2_ = 0x20;
    auVar16._24_2_ = 0x20;
    auVar16._26_2_ = 0x20;
    auVar16._28_2_ = 0x20;
    auVar16._30_2_ = 0x20;
    do {
      if (0 < width) {
        lVar7 = 0;
        do {
          auVar4 = vpermq_avx2(*(undefined1 (*) [32])(ppVar6 + lVar7),0x94);
          auVar5 = vpermq_avx2(*(undefined1 (*) [32])(ppVar6 + lVar7 + 0x10),0x94);
          auVar17 = vpshufb_avx2(auVar4,auVar12);
          auVar18 = vpshufb_avx2(auVar4,auVar13);
          auVar3 = vpshufb_avx2(auVar4,auVar14);
          auVar4 = vpshufb_avx2(auVar4,auVar15);
          auVar17 = vpmaddubsw_avx2(auVar17,auVar11);
          auVar18 = vpmaddubsw_avx2(auVar18,auVar10);
          auVar17 = vpaddw_avx2(auVar17,auVar18);
          auVar18 = vpmaddubsw_avx2(auVar3,auVar9);
          auVar3 = vpmaddubsw_avx2(auVar4,auVar8);
          auVar18 = vpaddw_avx2(auVar18,auVar3);
          auVar17 = vpaddw_avx2(auVar17,auVar18);
          auVar18 = vpshufb_avx2(auVar5,auVar12);
          auVar3 = vpshufb_avx2(auVar5,auVar13);
          auVar4 = vpshufb_avx2(auVar5,auVar14);
          auVar5 = vpshufb_avx2(auVar5,auVar15);
          auVar18 = vpmaddubsw_avx2(auVar18,auVar11);
          auVar3 = vpmaddubsw_avx2(auVar3,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar3);
          auVar3 = vpmaddubsw_avx2(auVar4,auVar9);
          auVar4 = vpmaddubsw_avx2(auVar5,auVar8);
          auVar3 = vpaddw_avx2(auVar3,auVar4);
          auVar18 = vpaddw_avx2(auVar18,auVar3);
          auVar17 = vpaddw_avx2(auVar17,auVar16);
          auVar18 = vpaddw_avx2(auVar18,auVar16);
          auVar17 = vpsraw_avx2(auVar17,6);
          auVar18 = vpsraw_avx2(auVar18,6);
          auVar2 = vpackuswb_avx(auVar17._0_16_,auVar17._16_16_);
          *(undefined1 (*) [16])(dst + lVar7) = auVar2;
          auVar2 = vpackuswb_avx(auVar18._0_16_,auVar18._16_16_);
          *(undefined1 (*) [16])(dst + lVar7 + 0x10) = auVar2;
          lVar7 = lVar7 + 0x20;
        } while (lVar7 < width);
      }
      height = height + -1;
      ppVar6 = ppVar6 + i_src;
      dst = dst + i_dst;
    } while (height != 0);
  }
  return;
}

Assistant:

void uavs3d_if_hor_luma_w32x_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    int col;
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    __m256i mSwitch1 = _mm256_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8);
    __m256i mSwitch2 = _mm256_setr_epi8(2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10);
    __m256i mSwitch3 = _mm256_setr_epi8(4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12);
    __m256i mSwitch4 = _mm256_setr_epi8(6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14);
    __m256i T0, T1, S0, S1, S2, S3, sum0, sum1, T2, T3;
    __m256i r0, r1, r2, r3;
    __m256i mCoefy1_hor = _mm256_set1_epi16(*(s16*)coeff);
    __m256i mCoefy2_hor = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i mCoefy3_hor = _mm256_set1_epi16(*(s16*)(coeff + 4));
    __m256i mCoefy4_hor = _mm256_set1_epi16(*(s16*)(coeff + 6));

    src -= 3;

    while (height--) {
        uavs3d_prefetch(src + i_src, _MM_HINT_NTA);
        for (col = 0; col < width; col += 32)
        {
            S0 = _mm256_loadu_si256((__m256i*)(src + col));
            S1 = _mm256_loadu_si256((__m256i*)(src + col + 16));
            S2 = _mm256_permute4x64_epi64(S0, 0x94);
            S3 = _mm256_permute4x64_epi64(S1, 0x94);

            r0 = _mm256_shuffle_epi8(S2, mSwitch1);
            r1 = _mm256_shuffle_epi8(S2, mSwitch2);
            r2 = _mm256_shuffle_epi8(S2, mSwitch3);
            r3 = _mm256_shuffle_epi8(S2, mSwitch4);

            T0 = _mm256_maddubs_epi16(r0, mCoefy1_hor);
            T1 = _mm256_maddubs_epi16(r1, mCoefy2_hor);
            T2 = _mm256_maddubs_epi16(r2, mCoefy3_hor);
            T3 = _mm256_maddubs_epi16(r3, mCoefy4_hor);

            r0 = _mm256_shuffle_epi8(S3, mSwitch1);
            r1 = _mm256_shuffle_epi8(S3, mSwitch2);
            r2 = _mm256_shuffle_epi8(S3, mSwitch3);
            r3 = _mm256_shuffle_epi8(S3, mSwitch4);

            r0 = _mm256_maddubs_epi16(r0, mCoefy1_hor);
            r1 = _mm256_maddubs_epi16(r1, mCoefy2_hor);
            r2 = _mm256_maddubs_epi16(r2, mCoefy3_hor);
            r3 = _mm256_maddubs_epi16(r3, mCoefy4_hor);

            T0 = _mm256_add_epi16(T0, T1);
            T1 = _mm256_add_epi16(T2, T3);
            r0 = _mm256_add_epi16(r0, r1);
            r1 = _mm256_add_epi16(r2, r3);
            sum0 = _mm256_add_epi16(T0, T1);
            sum1 = _mm256_add_epi16(r0, r1);

            sum0 = _mm256_add_epi16(sum0, mAddOffset);
            sum1 = _mm256_add_epi16(sum1, mAddOffset);
            sum0 = _mm256_srai_epi16(sum0, shift); 
            sum1 = _mm256_srai_epi16(sum1, shift);

            _mm_storeu_si128((__m128i*)(dst + col), _mm_packus_epi16(_mm256_castsi256_si128(sum0), _mm256_extracti128_si256(sum0, 1)));
            _mm_storeu_si128((__m128i*)(dst + col + 16), _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1)));
        }
        src += i_src;
        dst += i_dst;
    }
}